

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pembase64.c
# Opt level: O0

int ptls_base64_encode(uint8_t *data,size_t data_len,char *ptls_base64_text)

{
  long lVar1;
  int iVar2;
  int local_28;
  int local_24;
  int lt;
  int l;
  char *ptls_base64_text_local;
  size_t data_len_local;
  uint8_t *data_local;
  
  local_28 = 0;
  for (local_24 = 0; 2 < data_len - (long)local_24; local_24 = local_24 + 3) {
    ptls_base64_cell(data + local_24,ptls_base64_text + local_28);
    local_28 = local_28 + 4;
  }
  lVar1 = data_len - (long)local_24;
  if (data_len != (long)local_24) {
    if (lVar1 == 1) {
      ptls_base64_text[local_28] = ptls_base64_alphabet[(int)(uint)data[local_24] >> 2];
      ptls_base64_text[local_28 + 1] = ptls_base64_alphabet[(int)((data[local_24] & 3) << 4)];
      iVar2 = local_28 + 3;
      ptls_base64_text[local_28 + 2] = '=';
      local_28 = local_28 + 4;
      ptls_base64_text[iVar2] = '=';
    }
    else if (lVar1 == 2) {
      ptls_base64_text[local_28] = ptls_base64_alphabet[(int)(uint)data[local_24] >> 2];
      ptls_base64_text[local_28 + 1] =
           ptls_base64_alphabet
           [(int)((data[local_24] & 3) << 4 | (int)(uint)data[local_24 + 1] >> 4)];
      iVar2 = local_28 + 3;
      ptls_base64_text[local_28 + 2] = ptls_base64_alphabet[(int)((data[local_24 + 1] & 0xf) << 2)];
      local_28 = local_28 + 4;
      ptls_base64_text[iVar2] = '=';
    }
  }
  ptls_base64_text[local_28] = '\0';
  return local_28 + 1;
}

Assistant:

int ptls_base64_encode(const uint8_t *data, size_t data_len, char *ptls_base64_text)
{
    int l = 0;
    int lt = 0;

    while ((data_len - l) >= 3) {
        ptls_base64_cell(data + l, ptls_base64_text + lt);
        l += 3;
        lt += 4;
    }

    switch (data_len - l) {
    case 0:
        break;
    case 1:
        ptls_base64_text[lt++] = ptls_base64_alphabet[data[l] >> 2];
        ptls_base64_text[lt++] = ptls_base64_alphabet[(data[l] & 3) << 4];
        ptls_base64_text[lt++] = '=';
        ptls_base64_text[lt++] = '=';
        break;
    case 2:
        ptls_base64_text[lt++] = ptls_base64_alphabet[data[l] >> 2];
        ptls_base64_text[lt++] = ptls_base64_alphabet[((data[l] & 3) << 4) | (data[l + 1] >> 4)];
        ptls_base64_text[lt++] = ptls_base64_alphabet[((data[l + 1] & 15) << 2)];
        ptls_base64_text[lt++] = '=';
        break;
    default:
        break;
    }
    ptls_base64_text[lt++] = 0;

    return lt;
}